

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O1

int soplex::orderOfMagnitude(Rational *r)

{
  uint uVar1;
  bool bVar2;
  double dVar3;
  undefined8 uVar4;
  Rational *pRVar5;
  undefined8 __dest;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *pnVar6;
  bool bVar7;
  undefined4 uVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double result_1;
  double result;
  double result_3;
  data_type local_c8;
  uint local_b8;
  char local_b4;
  byte local_b3;
  byte local_b2;
  data_type local_a8;
  uint local_98;
  undefined1 local_94;
  byte local_93;
  byte local_92;
  undefined1 local_88 [16];
  data_type local_78;
  uint local_68;
  undefined1 local_64;
  byte local_63;
  byte local_62;
  data_type local_58;
  uint local_48;
  undefined1 local_44;
  byte local_43;
  byte local_42;
  double local_38;
  double local_30;
  
  uVar4 = &local_c8;
  local_c8.la[0] = 0;
  local_b2 = (r->m_backend).m_value.num.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_alias;
  uVar1 = (r->m_backend).m_value.num.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_limbs;
  local_b8 = 0;
  if ((bool)local_b2 != false) {
    local_b8 = uVar1;
  }
  local_b4 = (r->m_backend).m_value.num.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_sign;
  local_b3 = local_b2 ^ 1;
  if ((bool)local_b2 == true) {
    local_c8.la[0] =
         (r->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.la[0];
    local_c8.ld.data =
         (r->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_c8.ld,uVar1,uVar1);
    __dest = &local_c8;
    if (local_b3 == 0) {
      __dest = local_c8.ld.data;
    }
    pRVar5 = r;
    if ((r->m_backend).m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      pRVar5 = (Rational *)
               (r->m_backend).m_value.num.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_data.ld.data;
    }
    memcpy((void *)__dest,pRVar5,
           (ulong)(r->m_backend).m_value.num.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs << 3);
  }
  bVar7 = false;
  if ((local_b4 == '\0') && (local_b8 == 1)) {
    if (local_b3 == 0) {
      uVar4 = local_c8.ld.data;
    }
    bVar7 = *(unsigned_long_long *)uVar4 == 0;
  }
  bVar2 = true;
  if (!bVar7) {
    local_a8.la[0] = 0;
    local_92 = (r->m_backend).m_value.num.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_alias;
    uVar1 = (r->m_backend).m_value.num.m_backend.
            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            .m_limbs;
    local_98 = 0;
    if ((bool)local_92 != false) {
      local_98 = uVar1;
    }
    local_94 = (r->m_backend).m_value.num.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_sign;
    local_93 = local_92 ^ 1;
    if ((bool)local_92 == true) {
      local_a8.la[0] =
           (r->m_backend).m_value.num.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.la[0];
      local_a8.ld.data =
           (r->m_backend).m_value.num.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.ld.data;
    }
    else {
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_a8.ld,uVar1,uVar1);
      uVar4 = &local_a8;
      if (local_93 == 0) {
        uVar4 = local_a8.ld.data;
      }
      pRVar5 = r;
      if ((r->m_backend).m_value.num.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_internal == false) {
        pRVar5 = (Rational *)
                 (r->m_backend).m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_data.ld.data;
      }
      memcpy((void *)uVar4,pRVar5,
             (ulong)(r->m_backend).m_value.num.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_limbs << 3);
    }
    local_58.la[0] = 0;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::convert_to_imp<double>
              ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)&local_a8.ld,(double *)local_58.la);
    dVar3 = log10((double)local_58.la[0]);
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_8_ = dVar3;
    local_88._12_4_ = extraout_XMM0_Dd;
    pnVar6 = &(r->m_backend).m_value.den;
    local_58.la[0] = 0;
    local_42 = (r->m_backend).m_value.den.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_alias;
    uVar1 = (r->m_backend).m_value.den.m_backend.
            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            .m_limbs;
    local_48 = 0;
    if ((bool)local_42 != false) {
      local_48 = uVar1;
    }
    local_44 = (r->m_backend).m_value.den.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_sign;
    local_43 = local_42 ^ 1;
    if ((bool)local_42 == true) {
      local_58.la[0] =
           (pnVar6->m_backend).
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.la[0];
      local_58.ld.data =
           (r->m_backend).m_value.den.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.ld.data;
    }
    else {
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_58.ld,uVar1,uVar1);
      uVar4 = &local_58;
      if (local_43 == 0) {
        uVar4 = local_58.ld.data;
      }
      if ((r->m_backend).m_value.den.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_internal == false) {
        pnVar6 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                  *)(r->m_backend).m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data;
      }
      memcpy((void *)uVar4,pnVar6,
             (ulong)(r->m_backend).m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_limbs << 3);
    }
    iVar9 = (int)(double)local_88._8_8_;
    local_88._8_4_ = SUB84((double)iVar9,0);
    local_88._0_8_ = (double)(int)(double)local_88._0_8_;
    local_88._12_4_ = (int)((ulong)(double)iVar9 >> 0x20);
    local_78.la[0] = 0;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::convert_to_imp<double>
              ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)&local_58.ld,(double *)local_78.la);
    dVar3 = log10((double)local_78.la[0]);
    bVar2 = dVar3 == (double)local_88._0_8_;
  }
  if (!bVar7) {
    if ((local_43 == 0) && (local_42 == 0)) {
      operator_delete(local_58.ld.data,(local_58.la[0] & 0xffffffff) << 3);
    }
    if ((local_93 == 0) && (local_92 == 0)) {
      operator_delete(local_a8.ld.data,(local_a8.la[0] & 0xffffffff) << 3);
    }
  }
  if ((local_b3 == 0) && (local_b2 == 0)) {
    operator_delete(local_c8.ld.data,(local_c8.la[0] & 0xffffffff) << 3);
  }
  iVar9 = 0;
  if (!bVar2) {
    local_c8.la[0] = 0;
    local_b2 = (r->m_backend).m_value.num.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_alias;
    uVar1 = (r->m_backend).m_value.num.m_backend.
            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            .m_limbs;
    local_b8 = 0;
    if ((bool)local_b2 != false) {
      local_b8 = uVar1;
    }
    local_b4 = (r->m_backend).m_value.num.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_sign;
    local_b3 = local_b2 ^ 1;
    if ((bool)local_b2 == true) {
      local_c8.la[0] =
           (r->m_backend).m_value.num.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.la[0];
      local_c8.ld.data =
           (r->m_backend).m_value.num.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.ld.data;
    }
    else {
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_c8.ld,uVar1,uVar1);
      uVar4 = &local_c8;
      if (local_b3 == 0) {
        uVar4 = local_c8.ld.data;
      }
      pRVar5 = r;
      if ((r->m_backend).m_value.num.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_internal == false) {
        pRVar5 = (Rational *)
                 (r->m_backend).m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_data.ld.data;
      }
      memcpy((void *)uVar4,pRVar5,
             (ulong)(r->m_backend).m_value.num.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_limbs << 3);
    }
    local_78.la[0] = 0;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::convert_to_imp<double>
              ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)&local_c8.ld,(double *)local_78.la);
    dVar3 = log10((double)local_78.la[0]);
    local_88._0_8_ = dVar3;
    pnVar6 = &(r->m_backend).m_value.den;
    local_78.la[0] = 0;
    local_62 = (r->m_backend).m_value.den.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_alias;
    uVar1 = (r->m_backend).m_value.den.m_backend.
            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            .m_limbs;
    local_68 = 0;
    if ((bool)local_62 != false) {
      local_68 = uVar1;
    }
    local_64 = (r->m_backend).m_value.den.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_sign;
    local_63 = local_62 ^ 1;
    if ((bool)local_62 == true) {
      local_78.la[0] =
           (pnVar6->m_backend).
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.la[0];
      local_78.ld.data =
           (r->m_backend).m_value.den.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.ld.data;
    }
    else {
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_78.ld,uVar1,uVar1);
      uVar4 = &local_78;
      if (local_63 == 0) {
        uVar4 = local_78.ld.data;
      }
      if ((r->m_backend).m_value.den.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_internal == false) {
        pnVar6 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                  *)(r->m_backend).m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data;
      }
      memcpy((void *)uVar4,pnVar6,
             (ulong)(r->m_backend).m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_limbs << 3);
    }
    local_30 = 0.0;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::convert_to_imp<double>
              ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)&local_78.ld,&local_30);
    dVar3 = log10(local_30);
    uVar8 = SUB84(dVar3,0);
    uVar10 = (undefined4)((ulong)dVar3 >> 0x20);
    if ((local_63 == 0) && (local_62 == 0)) {
      local_38 = dVar3;
      operator_delete(local_78.ld.data,(local_78.la[0] & 0xffffffff) << 3);
      uVar8 = SUB84(local_38,0);
      uVar10 = (undefined4)((ulong)local_38 >> 0x20);
    }
    iVar9 = (int)(double)local_88._0_8_;
    if ((local_b3 == 0) && (local_b2 == 0)) {
      operator_delete(local_c8.ld.data,(local_c8.la[0] & 0xffffffff) << 3);
    }
    iVar9 = iVar9 - (int)(double)CONCAT44(uVar10,uVar8);
  }
  return iVar9;
}

Assistant:

inline int orderOfMagnitude(Rational& r)
{
   if(numerator(r) == 0 || (int) log10((double)numerator(r)) == log10((double)denominator(r)))
      return 0;
   else
      return (int) log10((double)numerator(r)) - (int) log10((double)denominator(r));
}